

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool DetectStaticData(FILE *fp,VecVector3d *gyro,VecVector3d *accel)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  size_t sVar25;
  ostream *poVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined1 auVar29 [16];
  Output p;
  double dStack_208;
  double dStack_80;
  value_type local_78;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  
  feof((FILE *)fp);
  local_38 = 0.0;
  dStack_30 = 0.0;
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_28 = 0.0;
  sVar25 = fread(&local_58,0x38,1,(FILE *)fp);
  dVar2 = dStack_50;
  if ((sVar25 != 0) && (ABS(dStack_50) <= 1.25e-05)) {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 0xf;
    poVar26 = (ostream *)std::ostream::operator<<(&std::cout,local_58);
    std::endl<char,std::char_traits<char>>(poVar26);
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (dStack_40 * 200.0 * 3600.0) / 206264.80624709636;
    auVar29._0_8_ = dVar2 * 200.0 * 3600.0;
    auVar29._8_8_ = local_48 * 200.0 * 3600.0;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
    _0_16_ = divpd(auVar29,_DAT_0010c380);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back(gyro,&local_78);
    dVar3 = local_28;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_28 * 200.0;
    dVar2 = local_38 * 200.0;
    uVar27 = SUB84(dStack_30 * 200.0,0);
    uVar28 = (undefined4)((ulong)(dStack_30 * 200.0) >> 0x20);
    auVar1._8_4_ = uVar27;
    auVar1._0_8_ = dVar2;
    auVar1._12_4_ = uVar28;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
    _0_4_ = uVar27;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = dVar2;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
    _4_4_ = uVar28;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back(accel,&local_78);
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = dVar3 * -200.0;
    dStack_80 = auVar1._8_8_;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = dStack_80;
    poVar26 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_78);
    poVar26 = std::endl<char,std::char_traits<char>>(poVar26);
    std::endl<char,std::char_traits<char>>(poVar26);
    *(undefined8 *)(poVar26 + *(long *)(*(long *)poVar26 + -0x18) + 8) = 5;
    poVar26 = (ostream *)std::ostream::operator<<(poVar26,(dStack_80 * 206264.80624709636) / 3600.0)
    ;
    poVar26 = std::operator<<(poVar26,"   ");
    poVar26 = (ostream *)std::ostream::operator<<(poVar26,(dVar2 * 206264.80624709636) / 3600.0);
    poVar26 = std::operator<<(poVar26,"   ");
    std::ostream::operator<<(poVar26,0.0);
    dVar3 = dVar3 * 0.5;
    dVar4 = cos(dVar3);
    dVar5 = cos(0.0);
    dVar2 = dVar2 * 0.5;
    dVar6 = cos(dVar2);
    dVar7 = sin(dVar3);
    dVar8 = sin(0.0);
    dVar9 = sin(dVar2);
    dVar10 = sin(dVar3);
    dVar11 = cos(0.0);
    dVar12 = cos(dVar2);
    dStack_208 = cos(dVar3);
    dVar13 = sin(0.0);
    dVar14 = sin(dVar2);
    dStack_208 = -dStack_208;
    dVar15 = cos(dVar3);
    dVar16 = sin(0.0);
    dVar17 = cos(dVar2);
    dVar18 = sin(dVar3);
    dVar19 = cos(0.0);
    dVar20 = sin(dVar2);
    dVar21 = cos(dVar3);
    dVar22 = cos(0.0);
    dVar23 = sin(dVar2);
    dVar3 = sin(dVar3);
    dVar24 = sin(0.0);
    dVar2 = cos(dVar2);
    *(double *)poVar26 = dVar12 * dVar11 * dVar10 + dVar14 * dStack_208 * dVar13;
    *(double *)(poVar26 + 8) = dVar17 * dVar16 * dVar15 + dVar20 * dVar19 * dVar18;
    *(double *)(poVar26 + 0x10) = dVar23 * dVar22 * dVar21 + dVar2 * -dVar3 * dVar24;
    *(double *)(poVar26 + 0x18) = dVar6 * dVar5 * dVar4 + dVar9 * dVar8 * dVar7;
    return SUB81(poVar26,0);
  }
  return sVar25 != 0;
}

Assistant:

bool DetectStaticData(FILE* fp, VecVector3d &gyro, VecVector3d &accel)
{
    while (!feof(fp))
    {
        Output p;
        if(!fread(&p, sizeof(p), 1, fp))
            return false;
        if(abs(p.gx) > 1.25e-5)
            return true;
        cout << setprecision(15) << p.time << endl;
        gyro.push_back(Vector3d(Deg2Rad(p.gx * ZCF), Deg2Rad(p.gy * ZCF), Deg2Rad(p.gz * ZCF)));
        accel.push_back(Vector3d(p.ax * ZCF, p.ay * ZCF, p.az * ZCF));
        cout << Vector3d(p.ax * ZCF, p.ay * ZCF, -p.az * ZCF) << endl << endl;
        break;
        // cout << gyro.size() << endl;
        // cout << accel.size() << endl;
    }
}